

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiftMotor.h
# Opt level: O2

void __thiscall LiftMotor::LiftMotor(LiftMotor *this,ofstream *myFile)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  
  this->zmin = 0;
  this->zmax = 10000;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"LIFT MOTOR INITIALIZED!");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)myFile);
  poVar3 = std::operator<<(poVar3,"LIFT MOTOR INITIALIZED!");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = rand();
  this->z = iVar1 % this->zmax;
  this->LimitSwitchBottom = false;
  this->LimitSwitchTop = false;
  return;
}

Assistant:

LiftMotor::LiftMotor(ofstream &myFile)
{
	srand(time(NULL));
	cout << endl << "LIFT MOTOR INITIALIZED!" << endl;
	myFile << endl << "LIFT MOTOR INITIALIZED!" << endl;
	z = rand() % zmax;
	LimitSwitchTop = false;
	LimitSwitchBottom = false;
}